

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O3

void __thiscall MppBufferService::~MppBufferService(MppBufferService *this)

{
  list_head *plVar1;
  RK_U32 RVar2;
  list_head *plVar3;
  list_head *plVar4;
  bool bVar5;
  hlist_node *phVar6;
  MppBufferGroupImpl *p;
  MppAllocator (*papvVar7) [8];
  bool bVar8;
  long lVar9;
  long lVar10;
  
  this->finalizing = 1;
  if (this->misc_count != 0) {
    lVar9 = 0;
    _mpp_log_l(4,"mpp_buffer","cleaning misc group\n","~MppBufferService");
    bVar5 = true;
    do {
      bVar8 = bVar5;
      lVar10 = 0;
      do {
        RVar2 = this->misc[lVar9][lVar10];
        if (RVar2 != 0) {
          for (phVar6 = this->mHashGroup[RVar2 * 0x61c88647 >> 0x18].first;
              phVar6 != (hlist_node *)0x0; phVar6 = phVar6->next) {
            if (*(RK_U32 *)((long)&phVar6[-9].pprev + 4) == RVar2) {
              p = (MppBufferGroupImpl *)&phVar6[-0xd].pprev;
              goto LAB_0015bc96;
            }
          }
          p = (MppBufferGroupImpl *)0x0;
LAB_0015bc96:
          put_group(this,"~MppBufferService",p);
          this->misc[lVar9][lVar10] = 0;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 5);
      lVar9 = 1;
      bVar5 = false;
    } while (bVar8);
  }
  plVar1 = &this->mListGroup;
  if ((this->mListGroup).next != plVar1) {
    if (((byte)mpp_buffer_debug & 0x20) != 0) {
      dump(this,"leaked group found");
    }
    _mpp_log_l(4,"mpp_buffer","cleaning leaked group\n","~MppBufferService");
    plVar4 = plVar1->next;
    while (plVar4 != plVar1) {
      plVar3 = plVar4->next;
      put_group(this,"~MppBufferService",(MppBufferGroupImpl *)&plVar4[-0x11].prev);
      plVar4 = plVar3;
    }
  }
  plVar1 = &this->mListOrphan;
  if ((this->mListOrphan).next != plVar1) {
    _mpp_log_l(4,"mpp_buffer","cleaning leaked buffer\n","~MppBufferService");
    plVar4 = plVar1->next;
    while (plVar4 != plVar1) {
      plVar3 = plVar4->next;
      *(undefined4 *)&plVar4[-0xc].prev = 1;
      *(undefined4 *)&plVar4[-0xb].prev = 1;
      put_group(this,"~MppBufferService",(MppBufferGroupImpl *)&plVar4[-0x11].prev);
      plVar4 = plVar3;
    }
  }
  this->finished = 1;
  papvVar7 = this->mAllocator;
  lVar9 = 0;
  do {
    lVar10 = 0;
    do {
      if (*(long *)((long)*papvVar7 + lVar10) != 0) {
        mpp_allocator_put((MppAllocator *)((long)*papvVar7 + lVar10));
      }
      lVar10 = lVar10 + 8;
    } while (lVar10 != 0x40);
    lVar9 = lVar9 + 1;
    papvVar7 = papvVar7 + 1;
  } while (lVar9 != 5);
  return;
}

Assistant:

MppBufferService::~MppBufferService()
{
    RK_S32 i, j;

    finalizing = 1;

    // first remove legacy group which is the normal case
    if (misc_count) {
        mpp_log_f("cleaning misc group\n");
        for (i = 0; i < MPP_BUFFER_MODE_BUTT; i++)
            for (j = 0; j < MPP_BUFFER_TYPE_BUTT; j++) {
                RK_U32 id = misc[i][j];

                if (id) {
                    put_group(__FUNCTION__, get_group_by_id(id));
                    misc[i][j] = 0;
                }
            }
    }

    // then remove the remaining group which is the leak one
    if (!list_empty(&mListGroup)) {
        MppBufferGroupImpl *pos, *n;

        if (mpp_buffer_debug & MPP_BUF_DBG_DUMP_ON_EXIT)
            dump("leaked group found");

        mpp_log_f("cleaning leaked group\n");
        list_for_each_entry_safe(pos, n, &mListGroup, MppBufferGroupImpl, list_group) {
            put_group(__FUNCTION__, pos);
        }
    }

    // remove all orphan buffer group
    if (!list_empty(&mListOrphan)) {
        MppBufferGroupImpl *pos, *n;

        mpp_log_f("cleaning leaked buffer\n");

        list_for_each_entry_safe(pos, n, &mListOrphan, MppBufferGroupImpl, list_group) {
            pos->clear_on_exit = 1;
            pos->is_finalizing = 1;
            put_group(__FUNCTION__, pos);
        }
    }
    finished = 1;

    for (i = 0; i < MPP_BUFFER_TYPE_BUTT; i++) {
        for (j = 0; j < MPP_ALLOCATOR_WITH_FLAG_NUM; j++) {
            if (mAllocator[i][j])
                mpp_allocator_put(&(mAllocator[i][j]));
        }
    }
}